

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void scalar_centered_binomial_distribution_eta_2_with_prf(scalar *out,uint8_t *input)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iStack_9c;
  uint16_t mask;
  uint16_t value;
  uint8_t byte;
  int i;
  uint8_t entropy [128];
  uint8_t *input_local;
  scalar *out_local;
  
  entropy._120_8_ = input;
  prf((uint8_t *)&value,0x80,input);
  for (iStack_9c = 0; iStack_9c < 0x100; iStack_9c = iStack_9c + 2) {
    bVar1 = *(byte *)((long)&value + (long)(iStack_9c / 2));
    uVar2 = ((bVar1 & 1) + ((ushort)((int)(uint)bVar1 >> 1) & 1)) -
            (((ushort)((int)(uint)bVar1 >> 2) & 1) + ((ushort)((int)(uint)bVar1 >> 3) & 1));
    out->c[iStack_9c] = uVar2 + (-(short)((int)(uint)uVar2 >> 0xf) & 0xd01U);
    uVar3 = (uint)bVar1;
    uVar2 = (((byte)((int)uVar3 >> 4) & 1) + ((ushort)((int)uVar3 >> 5) & 1)) -
            (((ushort)((int)uVar3 >> 6) & 1) + (short)((int)uVar3 >> 7));
    out->c[iStack_9c + 1] = uVar2 + (-(short)((int)(uint)uVar2 >> 0xf) & 0xd01U);
  }
  return;
}

Assistant:

static void scalar_centered_binomial_distribution_eta_2_with_prf(
    scalar *out, const uint8_t input[33]) {
  uint8_t entropy[128];
  static_assert(sizeof(entropy) == 2 * /*kEta=*/2 * DEGREE / 8, "");
  prf(entropy, sizeof(entropy), input);

  for (int i = 0; i < DEGREE; i += 2) {
    uint8_t byte = entropy[i / 2];

    uint16_t value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // Add |kPrime| if |value| underflowed. See |reduce_once| for a discussion
    // on why the value barrier is omitted. While this could have been written
    // reduce_once(value + kPrime), this is one extra addition and small range
    // of |value| tempts some versions of Clang to emit a branch.
    uint16_t mask = 0u - (value >> 15);
    out->c[i] = value + (kPrime & mask);

    byte >>= 4;
    value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // See above.
    mask = 0u - (value >> 15);
    out->c[i + 1] = value + (kPrime & mask);
  }
}